

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

int unknown_isName(ENCODING *enc,char *p)

{
  uint uVar1;
  char **in_RCX;
  uint uVar2;
  char *in_RDX;
  
  uVar1 = (*enc[3].literalScanners[1])((ENCODING *)enc[3].sameName,p,in_RDX,in_RCX);
  uVar2 = 0;
  if (uVar1 < 0x10000) {
    uVar2 = 1 << ((byte)uVar1 & 0x1f) &
            *(uint *)((long)namingBitmap +
                     (ulong)(uVar1 >> 3 & 0x1c |
                            (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[uVar1 >> 8] << 5));
  }
  return uVar2;
}

Assistant:

static
int unknown_isName(const ENCODING *enc, const char *p)
{
  int c = ((const struct unknown_encoding *)enc)
          ->convert(((const struct unknown_encoding *)enc)->userData, p);
  if (c & ~0xFFFF)
    return 0;
  return UCS2_GET_NAMING(namePages, c >> 8, c & 0xFF);
}